

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOneAction.cpp
# Opt level: O3

ActionResults * __thiscall WhiteRoomOneAction::Go(WhiteRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *this_01;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  itemType local_84;
  string local_80;
  string local_60;
  string local_40;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == LADDER) {
    local_84 = LADDER;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_84);
    iVar2 = ItemWrapper::getLocation(this_00);
    if (iVar2 != HIDDEN) {
      this_01 = (ActionResults *)operator_new(0x30);
      paVar4 = &local_40.field_2;
      local_40._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"You climb down the ladder","");
      ActionResults::ActionResults(this_01,W_ROOM2,&local_40);
      _Var3._M_p = local_40._M_dataplus._M_p;
      goto LAB_0011fea4;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  this_01 = (ActionResults *)operator_new(0x30);
  if (iVar1 == LIGHT) {
    paVar4 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"You feel warmer, more content on where your life is going.","");
    ActionResults::ActionResults(this_01,CURRENT,&local_60);
    _Var3._M_p = local_60._M_dataplus._M_p;
  }
  else {
    paVar4 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"You don\'t go anywhere","")
    ;
    ActionResults::ActionResults(this_01,CURRENT,&local_80);
    _Var3._M_p = local_80._M_dataplus._M_p;
  }
LAB_0011fea4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  return this_01;
}

Assistant:

ActionResults *WhiteRoomOneAction::Go() {
    if(commands->getMainItem() == LADDER && itemList->getValue(LADDER)->getLocation() != HIDDEN) {
        return new ActionResults(W_ROOM2, "You climb down the ladder");
    } else if(commands->getMainItem() == LIGHT){
        return new ActionResults(CURRENT, "You feel warmer, more content on where your life is going.");
    }
    else {
        return new ActionResults(CURRENT, "You don't go anywhere");
    }
}